

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O1

void __thiscall
chrono::ChArchiveOutJSON::out
          (ChArchiveOutJSON *this,
          ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *bVal)

{
  _Elt_pointer pbVar1;
  ChStreamOutAscii *pCVar2;
  _Elt_pointer piVar3;
  int iVar4;
  
  comma_cr(this);
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar4 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\t");
      iVar4 = iVar4 + 1;
    } while (iVar4 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  pbVar1 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 == (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pbVar1 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
  }
  if (pbVar1[-1] == false) {
    pCVar2 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,bVal->_name);
    pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar2,"\t: ");
  }
  pCVar2 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar2,(string *)bVal->_value);
  chrono::ChStreamOutAscii::operator<<(pCVar2,"\"");
  piVar3 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  piVar3[-1] = piVar3[-1] + 1;
  return;
}

Assistant:

virtual void out     (ChNameValue<std::string> bVal){
            comma_cr();
            indent();
            if (is_array.top()==false)
                (*ostream) << "\"" << bVal.name() << "\"" << "\t: ";
            (*ostream) << "\"" << bVal.value() << "\"";
            ++nitems.top();
      }